

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O3

OutputFile * __thiscall re2c::OutputFile::wind(OutputFile *this,uint32_t ind)

{
  OutputFragment *pOVar1;
  opt_t *poVar2;
  int iVar3;
  string str;
  char *local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  
  pOVar1 = ((this->blocks).
            super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]->fragments).
           super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1];
  local_48 = 0;
  local_40 = '\0';
  iVar3 = ind + 1;
  local_50 = &local_40;
  while( true ) {
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if ((poVar2->target == DOT) || (iVar3 = iVar3 + -1, iVar3 == 0)) break;
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)(poVar2->indString)._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pOVar1->stream,local_50,local_48);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return this;
}

Assistant:

OutputFile & OutputFile::wind (uint32_t ind)
{
	stream () << indent(ind);
	return *this;
}